

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  ImGuiID in_EDI;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiTableSettings *local_20;
  undefined4 in_stack_fffffffffffffff0;
  ImChunkStream<ImGuiTableSettings> *in_stack_fffffffffffffff8;
  
  local_20 = ImChunkStream<ImGuiTableSettings>::begin(&GImGui->SettingsTables);
  while( true ) {
    if (local_20 == (ImGuiTableSettings *)0x0) {
      return (ImGuiTableSettings *)0x0;
    }
    if (local_20->ID == in_EDI) break;
    local_20 = ImChunkStream<ImGuiTableSettings>::next_chunk
                         (in_stack_fffffffffffffff8,
                          (ImGuiTableSettings *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  }
  return local_20;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}